

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_get_ext(uchar **p,uchar *end,mbedtls_x509_buf *ext,int tag)

{
  int iVar1;
  size_t local_38;
  size_t len;
  int ret;
  int tag_local;
  mbedtls_x509_buf *ext_local;
  uchar *end_local;
  uchar **p_local;
  
  if (*p == end) {
    p_local._4_4_ = 0;
  }
  else {
    ext->tag = (uint)**p;
    len._4_4_ = tag;
    _ret = ext;
    ext_local = (mbedtls_x509_buf *)end;
    end_local = (uchar *)p;
    len._0_4_ = mbedtls_asn1_get_tag(p,end,&ext->len,tag | 0xa0);
    p_local._4_4_ = (int)len;
    if ((int)len == 0) {
      _ret->p = *(uchar **)end_local;
      ext_local = (mbedtls_x509_buf *)(*(long *)end_local + _ret->len);
      iVar1 = mbedtls_asn1_get_tag((uchar **)end_local,(uchar *)ext_local,&local_38,0x30);
      if (iVar1 == 0) {
        if (ext_local == (mbedtls_x509_buf *)(*(long *)end_local + local_38)) {
          p_local._4_4_ = 0;
        }
        else {
          p_local._4_4_ = -0x2566;
        }
      }
      else {
        p_local._4_4_ = iVar1 + -0x2500;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_x509_get_ext( unsigned char **p, const unsigned char *end,
                  mbedtls_x509_buf *ext, int tag )
{
    int ret;
    size_t len;

    if( *p == end )
        return( 0 );

    ext->tag = **p;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &ext->len,
            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | tag ) ) != 0 )
        return( ret );

    ext->p = *p;
    end = *p + ext->len;

    /*
     * Extensions  ::=  SEQUENCE SIZE (1..MAX) OF Extension
     *
     * Extension  ::=  SEQUENCE  {
     *      extnID      OBJECT IDENTIFIER,
     *      critical    BOOLEAN DEFAULT FALSE,
     *      extnValue   OCTET STRING  }
     */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

    if( end != *p + len )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}